

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall ft::list<int,_ft::allocator<int>_>::listInit(list<int,_ft::allocator<int>_> *this)

{
  pointer plVar1;
  node *pnVar2;
  node *pnVar3;
  undefined1 *this_00;
  int local_5c;
  listNode<int> local_58;
  int local_2c;
  listNode<int> local_28;
  list<int,_ft::allocator<int>_> *local_10;
  list<int,_ft::allocator<int>_> *this_local;
  
  this_00 = &this->field_0x18;
  local_10 = this;
  plVar1 = allocator<ft::listNode<int>_>::allocate((allocator<ft::listNode<int>_> *)this_00,1);
  this->m_head = plVar1;
  plVar1 = allocator<ft::listNode<int>_>::allocate((allocator<ft::listNode<int>_> *)this_00,1);
  this->m_tail = plVar1;
  plVar1 = this->m_head;
  local_2c = 0;
  listNode<int>::listNode(&local_28,&local_2c);
  allocator<ft::listNode<int>_>::construct
            ((allocator<ft::listNode<int>_> *)this_00,plVar1,&local_28);
  listNode<int>::~listNode(&local_28);
  plVar1 = this->m_tail;
  local_5c = 0;
  listNode<int>::listNode(&local_58,&local_5c);
  allocator<ft::listNode<int>_>::construct
            ((allocator<ft::listNode<int>_> *)&this->field_0x18,plVar1,&local_58);
  listNode<int>::~listNode(&local_58);
  pnVar2 = tail(this);
  pnVar3 = head(this);
  pnVar3->next = pnVar2;
  pnVar2 = head(this);
  pnVar3 = tail(this);
  pnVar3->prev = pnVar2;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}